

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::Aborted::receive(Aborted *this,size_t maxSize)

{
  char *pcVar1;
  size_t sVar2;
  _func_int **pp_Var3;
  char (*in_RCX) [41];
  String local_1d8;
  _func_int **local_1b8;
  Exception local_1b0;
  
  kj::_::Debug::makeDescription<char_const(&)[41]>
            (&local_1d8,(Debug *)"\"other end of WebSocketPipe was destroyed\"",
             "other end of WebSocketPipe was destroyed",in_RCX);
  Exception::Exception
            (&local_1b0,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x114a,&local_1d8);
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
            ((PromiseDisposer *)&local_1b8,&local_1b0);
  pp_Var3 = local_1b8;
  local_1b8 = (_func_int **)0x0;
  (this->super_WebSocket)._vptr_WebSocket = pp_Var3;
  Exception::~Exception(&local_1b0);
  sVar2 = local_1d8.content.size_;
  pcVar1 = local_1d8.content.ptr;
  if (local_1d8.content.ptr != (char *)0x0) {
    local_1d8.content.ptr = (char *)0x0;
    local_1d8.content.size_ = 0;
    (**(local_1d8.content.disposer)->_vptr_ArrayDisposer)
              (local_1d8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Message> receive(size_t maxSize) override {
      return KJ_EXCEPTION(DISCONNECTED, "other end of WebSocketPipe was destroyed");
    }